

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alone_encoder.c
# Opt level: O1

lzma_ret alone_encode(void *coder_ptr,lzma_allocator *allocator,uint8_t *in,size_t *in_pos,
                     size_t in_size,uint8_t *out,size_t *out_pos,size_t out_size,lzma_action action)

{
  lzma_ret lVar1;
  
  if (*out_pos < out_size) {
    do {
      if (*(int *)((long)coder_ptr + 0x48) != 0) {
        if (*(int *)((long)coder_ptr + 0x48) == 1) {
          lVar1 = (**(code **)((long)coder_ptr + 0x18))(*coder_ptr,allocator,in,in_pos,in_size,out);
          return lVar1;
        }
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/liblzma/common/alone_encoder.c"
                      ,0x3c,
                      "lzma_ret alone_encode(void *, const lzma_allocator *, const uint8_t *restrict, size_t *restrict, size_t, uint8_t *restrict, size_t *restrict, size_t, lzma_action)"
                     );
      }
      lzma_bufcpy((uint8_t *)((long)coder_ptr + 0x58),(size_t *)((long)coder_ptr + 0x50),0xd,out,
                  out_pos,out_size);
    } while ((0xc < *(size_t *)((long)coder_ptr + 0x50)) &&
            (*(undefined4 *)((long)coder_ptr + 0x48) = 1, *out_pos < out_size));
  }
  return LZMA_OK;
}

Assistant:

static lzma_ret
alone_encode(void *coder_ptr, const lzma_allocator *allocator,
		const uint8_t *restrict in, size_t *restrict in_pos,
		size_t in_size, uint8_t *restrict out,
		size_t *restrict out_pos, size_t out_size,
		lzma_action action)
{
	lzma_alone_coder *coder = coder_ptr;

	while (*out_pos < out_size)
	switch (coder->sequence) {
	case SEQ_HEADER:
		lzma_bufcpy(coder->header, &coder->header_pos,
				ALONE_HEADER_SIZE,
				out, out_pos, out_size);
		if (coder->header_pos < ALONE_HEADER_SIZE)
			return LZMA_OK;

		coder->sequence = SEQ_CODE;
		break;

	case SEQ_CODE:
		return coder->next.code(coder->next.coder,
				allocator, in, in_pos, in_size,
				out, out_pos, out_size, action);

	default:
		assert(0);
		return LZMA_PROG_ERROR;
	}

	return LZMA_OK;
}